

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flags.cc
# Opt level: O1

Flags * __thiscall
flow::util::Flags::defineBool
          (Flags *this,string *longOpt,char shortOpt,string *helpText,
          function<void_(bool)> *callback)

{
  _Any_data local_b8;
  code *local_a8;
  undefined8 uStack_a0;
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  string local_78;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_58;
  bool local_38;
  
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"<bool>","");
  local_38 = false;
  std::function<void_(bool)>::function((function<void_(bool)> *)&local_b8,callback);
  local_88 = (code *)0x0;
  pcStack_80 = (code *)0x0;
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  local_98._M_unused._M_object = operator_new(0x20);
  *(undefined8 *)local_98._M_unused._0_8_ = 0;
  *(undefined8 *)((long)local_98._M_unused._0_8_ + 8) = 0;
  *(undefined8 *)((long)local_98._M_unused._0_8_ + 0x10) = 0;
  *(undefined8 *)((long)local_98._M_unused._0_8_ + 0x18) = uStack_a0;
  if (local_a8 != (code *)0x0) {
    *(void **)local_98._M_unused._0_8_ = local_b8._M_unused._M_object;
    *(undefined8 *)((long)local_98._M_unused._0_8_ + 8) = local_b8._8_8_;
    *(code **)((long)local_98._M_unused._0_8_ + 0x10) = local_a8;
    local_a8 = (code *)0x0;
    uStack_a0 = 0;
  }
  pcStack_80 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/util/Flags.cc:234:7)>
               ::_M_invoke;
  local_88 = std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/util/Flags.cc:234:7)>
             ::_M_manager;
  define(this,longOpt,shortOpt,false,Bool,&local_78,helpText,
         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)&local_58,
         (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *)&local_98);
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  if (local_a8 != (code *)0x0) {
    (*local_a8)(&local_b8,&local_b8,__destroy_functor);
  }
  if (local_38 == true) {
    local_38 = false;
    if (local_58._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_58._M_value + 0x10)) {
      operator_delete((void *)local_58._M_value._M_dataplus._M_p,local_58._16_8_ + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  return this;
}

Assistant:

Flags& Flags::defineBool(
    const std::string& longOpt,
    char shortOpt,
    const std::string& helpText,
    std::function<void(bool)> callback) {

  return define(
      longOpt, shortOpt, false, FlagType::Bool, "<bool>",
      helpText, std::nullopt,
      [=](const std::string& value) {
        if (callback) {
          callback(value == "true");
        }
      });
}